

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::TextToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,size_t offset)

{
  Location loc;
  TokenType token_type_00;
  string_view text;
  Location local_40;
  size_t local_20;
  size_t offset_local;
  WastLexer *pWStack_10;
  TokenType token_type_local;
  WastLexer *this_local;
  
  local_20 = offset;
  offset_local._4_4_ = token_type;
  pWStack_10 = this;
  GetLocation(&local_40,this);
  token_type_00 = offset_local._4_4_;
  text = GetText(this,local_20);
  loc.filename._M_str = local_40.filename._M_str;
  loc.filename._M_len = local_40.filename._M_len;
  loc.field_1.field_1.offset = local_40.field_1.field_1.offset;
  loc.field_1._8_8_ = local_40.field_1._8_8_;
  Token::Token(__return_storage_ptr__,loc,token_type_00,text);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::TextToken(TokenType token_type, size_t offset) {
  return Token(GetLocation(), token_type, GetText(offset));
}